

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::DisableAllJoiners
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType)

{
  ErrorCode EVar1;
  ulong uVar2;
  element_type *peVar3;
  int iVar4;
  char *pcVar5;
  ushort uVar6;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  format_args args;
  undefined1 local_100 [8];
  pointer local_f8;
  pointer local_e0 [3];
  pointer local_c8 [3];
  undefined8 local_b0;
  string local_a8;
  undefined1 local_88 [8];
  char *local_80;
  size_t local_78;
  char local_70 [8];
  format_string_checker<char> *local_68;
  parse_func local_60 [1];
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_100._0_2_ = (this->mCommDataset).mBorderAgentLocator;
  local_100._2_2_ = (this->mCommDataset).mSessionId;
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             &(this->mCommDataset).mSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
             &(this->mCommDataset).mAeSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
             &(this->mCommDataset).mNmkpSteeringData);
  uVar2._0_2_ = (this->mCommDataset).mJoinerUdpPort;
  uVar2._2_2_ = (this->mCommDataset).mAeUdpPort;
  uVar2._4_2_ = (this->mCommDataset).mNmkpUdpPort;
  uVar2._6_2_ = (this->mCommDataset).mPresentFlags;
  local_b0 = uVar2 & 0x3fffffffffffffff;
  if (aType == kMeshCoP) {
    uVar6 = 0x2000;
  }
  else if (aType == kNMKP) {
    uVar6 = 0x800;
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)local_c8;
  }
  else {
    if (aType != kAE) {
      abort();
    }
    uVar6 = 0x1000;
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)local_e0;
  }
  local_b0._6_2_ = uVar2._6_2_ & 0x3fff | uVar6;
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_88._0_4_ = none_type;
    local_80 = "the commissioner is not active";
    local_78 = 0x1e;
    local_70 = (char  [8])0x0;
    local_60[0] = (parse_func)0x0;
    begin = "the commissioner is not active";
    local_68 = (format_string_checker<char> *)local_88;
    do {
      pcVar5 = begin + 1;
      if (*begin == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_88);
      }
      begin = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)0x233cbc,(string_view)ZEXT816(0x1e),args);
    local_58 = kInvalidState;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    __return_storage_ptr__->mCode = local_58;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    local_88._0_4_ = local_88._0_4_ & 0xffffff00;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              (this_00,local_88);
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x14])(local_88,peVar3,local_100);
    __return_storage_ptr__->mCode = local_88._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_80)
    ;
    EVar1 = __return_storage_ptr__->mCode;
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if (EVar1 == kNone) {
      MergeDataset(&this->mCommDataset,(CommissionerDataset *)local_100);
      EraseAllJoiners(this,aType);
    }
  }
  if (local_c8[0] != (pointer)0x0) {
    operator_delete(local_c8[0]);
  }
  if (local_e0[0] != (pointer)0x0) {
    operator_delete(local_e0[0]);
  }
  if (local_f8 != (pointer)0x0) {
    operator_delete(local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::DisableAllJoiners(JoinerType aType)
{
    Error error;
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    // Set steering data to all 0 to disable all joiners.
    steeringData = {0x00};
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    EraseAllJoiners(aType);

exit:
    return error;
}